

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Field.cpp
# Opt level: O2

void __thiscall
OpenMD::Field<double>::Field
          (Field<double> *this,SimInfo *info,string *filename,string *sele,RealType voxelSize)

{
  SelectionManager *this_00;
  SelectionEvaluator *this_01;
  Vector3i *this_02;
  bool bVar1;
  Snapshot *this_03;
  long lVar2;
  undefined8 *puVar3;
  int iVar4;
  undefined8 *puVar5;
  long lVar6;
  long lVar7;
  int j;
  long lVar8;
  RealType RVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  RectMatrix<double,_3U,_3U> local_1d0;
  Vector3d C;
  Vector3d B;
  Vector3d A;
  Mat3x3d box;
  string local_e0;
  Vector3d CxA;
  Vector3d BxC;
  Vector3d AxB;
  Mat3x3d invBox;
  
  StaticAnalyser::StaticAnalyser(&this->super_StaticAnalyser,info,filename,1);
  (this->super_StaticAnalyser)._vptr_StaticAnalyser = (_func_int **)&PTR__Field_002edca0;
  std::__cxx11::string::string((string *)&this->selectionScript_,(string *)sele);
  this_00 = &this->seleMan_;
  SelectionManager::SelectionManager(this_00,info);
  this_01 = &this->evaluator_;
  SelectionEvaluator::SelectionEvaluator(this_01,info);
  this->voxelSize_ = voxelSize;
  this_02 = &this->nBins_;
  Vector<int,_3U>::Vector(&this_02->super_Vector<int,_3U>);
  (this->field_).
  super__Vector_base<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->field_).
  super__Vector_base<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->dens_).
  super__Vector_base<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->field_).
  super__Vector_base<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->dens_).
  super__Vector_base<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->dens_).
  super__Vector_base<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  SelectionEvaluator::loadScriptString(this_01,sele);
  if ((this->evaluator_).isDynamic_ == false) {
    SelectionEvaluator::evaluate((SelectionSet *)&box,this_01);
    SelectionManager::setSelectionSet(this_00,(SelectionSet *)&box);
    std::vector<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>::~vector
              ((vector<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_> *)&box);
  }
  iVar4 = SelectionManager::getSelectionCount(this_00);
  SquareMatrix<double,_3>::SquareMatrix(&box.super_SquareMatrix<double,_3>);
  SquareMatrix<double,_3>::SquareMatrix(&invBox.super_SquareMatrix<double,_3>);
  bVar1 = (bool)(((this->super_StaticAnalyser).info_)->simParams_->UsePeriodicBoundaryConditions).
                super_ParameterBase.field_0x2b;
  this->usePeriodicBoundaryConditions_ = bVar1;
  if (bVar1 == false) {
    Snapshot::getBoundingBox((Mat3x3d *)&local_1d0,this->snap_);
    RectMatrix<double,_3U,_3U>::operator=((RectMatrix<double,_3U,_3U> *)&box,&local_1d0);
    Snapshot::getInvBoundingBox((Mat3x3d *)&local_1d0,this->snap_);
  }
  else {
    Snapshot::getHmat((Mat3x3d *)&local_1d0,this->snap_);
    RectMatrix<double,_3U,_3U>::operator=((RectMatrix<double,_3U,_3U> *)&box,&local_1d0);
    Snapshot::getInvHmat((Mat3x3d *)&local_1d0,this->snap_);
  }
  RectMatrix<double,_3U,_3U>::operator=((RectMatrix<double,_3U,_3U> *)&invBox,&local_1d0);
  this_03 = ((this->super_StaticAnalyser).info_)->sman_->currentSnapshot_;
  this->snap_ = this_03;
  if (iVar4 == 0) {
    dVar10 = voxelSize + voxelSize;
  }
  else {
    RVar9 = Snapshot::getVolume(this_03);
    dVar10 = pow(RVar9 / (double)iVar4,0.3333333333333333);
  }
  this->reffective_ = dVar10;
  this->rcut_ = dVar10 * 3.0;
  RectMatrix<double,_3U,_3U>::getColumn
            ((Vector<double,_3U> *)&local_1d0,(RectMatrix<double,_3U,_3U> *)&box,0);
  Vector<double,_3U>::Vector(&A.super_Vector<double,_3U>,(Vector<double,_3U> *)&local_1d0);
  RectMatrix<double,_3U,_3U>::getColumn
            ((Vector<double,_3U> *)&local_1d0,(RectMatrix<double,_3U,_3U> *)&box,1);
  Vector<double,_3U>::Vector(&B.super_Vector<double,_3U>,(Vector<double,_3U> *)&local_1d0);
  RectMatrix<double,_3U,_3U>::getColumn
            ((Vector<double,_3U> *)&local_1d0,(RectMatrix<double,_3U,_3U> *)&box,2);
  Vector<double,_3U>::Vector(&C.super_Vector<double,_3U>,(Vector<double,_3U> *)&local_1d0);
  cross<double>(&AxB,&A,&B);
  cross<double>(&BxC,&B,&C);
  cross<double>(&CxA,&C,&A);
  Vector<double,_3U>::normalize(&AxB.super_Vector<double,_3U>);
  Vector<double,_3U>::normalize(&BxC.super_Vector<double,_3U>);
  Vector<double,_3U>::normalize(&CxA.super_Vector<double,_3U>);
  dVar11 = dot<double,3u>(&A.super_Vector<double,_3U>,&BxC.super_Vector<double,_3U>);
  dVar12 = dot<double,3u>(&B.super_Vector<double,_3U>,&CxA.super_Vector<double,_3U>);
  dVar13 = dot<double,3u>(&C.super_Vector<double,_3U>,&AxB.super_Vector<double,_3U>);
  dVar10 = this->voxelSize_;
  auVar14._0_8_ = ABS(dVar11);
  auVar14._8_8_ = ABS(dVar12);
  auVar15._8_8_ = dVar10;
  auVar15._0_8_ = dVar10;
  auVar15 = divpd(auVar14,auVar15);
  *(ulong *)(this->nBins_).super_Vector<int,_3U>.data_ =
       CONCAT44((int)auVar15._8_8_,(int)auVar15._0_8_);
  (this->nBins_).super_Vector<int,_3U>.data_[2] = (int)(ABS(dVar13) / dVar10);
  std::
  vector<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
  ::resize(&this->field_,(long)(int)auVar15._0_8_);
  std::
  vector<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
  ::resize(&this->dens_,(long)(this_02->super_Vector<int,_3U>).data_[0]);
  for (lVar6 = 0; lVar6 < (this_02->super_Vector<int,_3U>).data_[0]; lVar6 = lVar6 + 1) {
    std::
    vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
    ::resize((this->field_).
             super__Vector_base<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start + lVar6,
             (long)(this->nBins_).super_Vector<int,_3U>.data_[1]);
    std::
    vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
    ::resize((this->dens_).
             super__Vector_base<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start + lVar6,
             (long)(this->nBins_).super_Vector<int,_3U>.data_[1]);
    for (lVar8 = 0; lVar8 < (this->nBins_).super_Vector<int,_3U>.data_[1]; lVar8 = lVar8 + 1) {
      lVar7 = lVar8 * 0x18;
      std::vector<double,_std::allocator<double>_>::resize
                ((vector<double,_std::allocator<double>_> *)
                 (*(long *)&(this->field_).
                            super__Vector_base<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start[lVar6].
                            super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                            ._M_impl.super__Vector_impl_data + lVar7),
                 (long)(this->nBins_).super_Vector<int,_3U>.data_[2]);
      std::vector<double,_std::allocator<double>_>::resize
                ((vector<double,_std::allocator<double>_> *)
                 (*(long *)&(this->dens_).
                            super__Vector_base<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start[lVar6].
                            super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                            ._M_impl.super__Vector_impl_data + lVar7),
                 (long)(this->nBins_).super_Vector<int,_3U>.data_[2]);
      lVar2 = *(long *)&(this->dens_).
                        super__Vector_base<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start[lVar6].
                        super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                        ._M_impl.super__Vector_impl_data;
      puVar3 = *(undefined8 **)(lVar2 + 8 + lVar7);
      for (puVar5 = *(undefined8 **)(lVar2 + lVar7); puVar5 != puVar3; puVar5 = puVar5 + 1) {
        *puVar5 = 0;
      }
      lVar2 = *(long *)&(this->field_).
                        super__Vector_base<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start[lVar6].
                        super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                        ._M_impl.super__Vector_impl_data;
      puVar3 = *(undefined8 **)(lVar2 + 8 + lVar7);
      for (puVar5 = *(undefined8 **)(lVar2 + lVar7); puVar5 != puVar3; puVar5 = puVar5 + 1) {
        *puVar5 = 0;
      }
    }
  }
  getPrefix(&local_e0,filename);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_1d0,
                 &local_e0,".field");
  std::__cxx11::string::_M_assign((string *)&(this->super_StaticAnalyser).outputFilename_);
  std::__cxx11::string::~string((string *)&local_1d0);
  std::__cxx11::string::~string((string *)&local_e0);
  return;
}

Assistant:

Field<T>::Field(SimInfo* info, const std::string& filename,
                  const std::string& sele, RealType voxelSize) :
      StaticAnalyser(info, filename, 1),
      selectionScript_(sele), seleMan_(info), evaluator_(info),
      voxelSize_(voxelSize) {
    evaluator_.loadScriptString(sele);
    if (!evaluator_.isDynamic()) {
      seleMan_.setSelectionSet(evaluator_.evaluate());
    }

    int nSelected = seleMan_.getSelectionCount();

    Mat3x3d box;
    Mat3x3d invBox;

    usePeriodicBoundaryConditions_ =
        info_->getSimParams()->getUsePeriodicBoundaryConditions();

    if (!usePeriodicBoundaryConditions_) {
      box    = snap_->getBoundingBox();
      invBox = snap_->getInvBoundingBox();
    } else {
      box    = snap_->getHmat();
      invBox = snap_->getInvHmat();
    }

    // reff will be used in the gaussian weighting of the
    // should be based on r_{effective}
    snap_ = info_->getSnapshotManager()->getCurrentSnapshot();
    if (nSelected == 0) {
      reffective_ = 2.0 * voxelSize;
    } else {
      reffective_ = pow((snap_->getVolume() / nSelected), 1. / 3.);
    }
    rcut_ = 3.0 * reffective_;

    Vector3d A = box.getColumn(0);
    Vector3d B = box.getColumn(1);
    Vector3d C = box.getColumn(2);

    // Required for triclinic cells
    Vector3d AxB = cross(A, B);
    Vector3d BxC = cross(B, C);
    Vector3d CxA = cross(C, A);

    // unit vectors perpendicular to the faces of the triclinic cell:
    AxB.normalize();
    BxC.normalize();
    CxA.normalize();

    // A set of perpendicular lengths in triclinic cells:
    RealType Wa = abs(dot(A, BxC));
    RealType Wb = abs(dot(B, CxA));
    RealType Wc = abs(dot(C, AxB));

    nBins_.x() = int(Wa / voxelSize_);
    nBins_.y() = int(Wb / voxelSize_);
    nBins_.z() = int(Wc / voxelSize_);

    // Build the field histogram and dens histogram and fill with zeros.
    field_.resize(nBins_.x());
    dens_.resize(nBins_.x());
    for (int i = 0; i < nBins_.x(); ++i) {
      field_[i].resize(nBins_.y());
      dens_[i].resize(nBins_.y());
      for (int j = 0; j < nBins_.y(); ++j) {
        field_[i][j].resize(nBins_.z());
        dens_[i][j].resize(nBins_.z());

        std::fill(dens_[i][j].begin(), dens_[i][j].end(), 0.0);
        std::fill(field_[i][j].begin(), field_[i][j].end(), T(0.0));
      }
    }

    setOutputName(getPrefix(filename) + ".field");
  }